

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SoftmaxNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_softmaxnd(NeuralNetworkLayer *this)

{
  bool bVar1;
  SoftmaxNDLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_softmaxnd(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_softmaxnd(this);
    this_00 = (SoftmaxNDLayerParams *)operator_new(0x20);
    SoftmaxNDLayerParams::SoftmaxNDLayerParams(this_00);
    (this->layer_).softmaxnd_ = this_00;
  }
  return (SoftmaxNDLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SoftmaxNDLayerParams* NeuralNetworkLayer::mutable_softmaxnd() {
  if (!has_softmaxnd()) {
    clear_layer();
    set_has_softmaxnd();
    layer_.softmaxnd_ = new ::CoreML::Specification::SoftmaxNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.softmaxND)
  return layer_.softmaxnd_;
}